

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall
NLReaderTest_ReadInitialValues_Test::TestBody(NLReaderTest_ReadInitialValues_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  char *pcVar5;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  AssertionResult local_198;
  undefined1 local_188 [16];
  string local_178;
  internal local_158 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_198._0_8_ = (AssertHelperData *)local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ","");
  plVar3 = (long *)std::__cxx11::string::append(&local_198.success_);
  paVar1 = &local_1b8.field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_1b8.field_2._M_allocated_capacity = *psVar4;
    local_1b8.field_2._8_4_ = (undefined4)plVar3[3];
    local_1b8.field_2._12_4_ = *(undefined4 *)((long)plVar3 + 0x1c);
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1b8.field_2._M_allocated_capacity = *psVar4;
    local_1b8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_1b8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"x5\n4 1.1\n3 0\n2 1\n1 2\n0 3\n","");
  ReadNL(&local_178,&local_c8,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_158,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"v4 := 1.1; v3 := 0; v2 := 1; v1 := 2; v0 := 3;\""
             ,"ReadNL(\"x5\\n4 1.1\\n3 0\\n2 1\\n1 2\\n0 3\\n\")",&local_1b8,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_198._0_8_ != (AssertHelperData *)local_188) {
    operator_delete((void *)local_198._0_8_,local_188._0_8_ + 1);
  }
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_150.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_150.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x574,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((string)local_198.success_ == (string)0x1) {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"(input):17:2: too many initial values","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"x6\n","");
      ReadNL(&local_48,&local_e8,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_198,
               (char (*) [93])
               "Expected: ReadNL(\"x6\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_1b8);
  if (local_198.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((local_198.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_178,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x575,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_1b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_198.success_ == (string)0x1) {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"(input):18:1: expected unsigned integer","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"x1\n-1 0\n","");
      ReadNL(&local_68,&local_108,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_198,
               (char (*) [99])
               "Expected: ReadNL(\"x1\\n-1 0\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_1b8);
  if (local_198.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((local_198.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_178,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x576,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_1b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_198.success_ == (string)0x1) {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"(input):18:1: integer 5 out of bounds","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"x1\n5 0\n","");
      ReadNL(&local_88,&local_128,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_198,
               (char (*) [98])
               "Expected: ReadNL(\"x1\\n5 0\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_1b8);
  if (local_198.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((local_198.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_178,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x577,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_1b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((string)local_198.success_ == (string)0x1) {
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"(input):19:1: expected unsigned integer","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"x2\n4 1.1\n\n","");
      ReadNL(&local_a8,&local_148,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    testing::AssertionResult::operator<<
              (&local_198,
               (char (*) [102])
               "Expected: ReadNL(\"x2\\n4 1.1\\n\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_1b8);
  if (local_198.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((local_198.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_178,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x578,pcVar5);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_178,(Message *)&local_1b8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_178);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_1b8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_198.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

std::string FormatHeader(const NLHeader &h, bool var_bounds = true) {
  fmt::MemoryWriter w;
  w << h;
  if (var_bounds) {
    w << "b\n";
    for (int i = 0; i < h.num_vars; ++i)
      w << "1 0\n";
  }
  return w.str();
}